

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_throttle_configure
               (ENetPeer *peer,uint32_t interval,uint32_t acceleration,uint32_t deceleration,
               uint32_t threshold)

{
  ENetProtocol command;
  ENetProtocol local_30;
  
  peer->packetThrottleThreshold = threshold;
  peer->packetThrottleInterval = interval;
  peer->packetThrottleAcceleration = acceleration;
  peer->packetThrottleDeceleration = deceleration;
  local_30._0_2_ = 0xff8b;
  local_30.disconnect.data =
       interval >> 0x18 | (interval & 0xff0000) >> 8 | (interval & 0xff00) << 8 | interval << 0x18;
  local_30.connect.mtu =
       acceleration >> 0x18 | (acceleration & 0xff0000) >> 8 | (acceleration & 0xff00) << 8 |
       acceleration << 0x18;
  local_30.connect.windowSize =
       deceleration >> 0x18 | (deceleration & 0xff0000) >> 8 | (deceleration & 0xff00) << 8 |
       deceleration << 0x18;
  enet_peer_queue_outgoing_command(peer,&local_30,(ENetPacket *)0x0,0,0);
  return;
}

Assistant:

void enet_peer_throttle_configure(ENetPeer* peer, uint32_t interval, uint32_t acceleration, uint32_t deceleration, uint32_t threshold) {
	ENetProtocol command;
	peer->packetThrottleThreshold = threshold;
	peer->packetThrottleInterval = interval;
	peer->packetThrottleAcceleration = acceleration;
	peer->packetThrottleDeceleration = deceleration;
	command.header.command = ENET_PROTOCOL_COMMAND_THROTTLE_CONFIGURE | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.throttleConfigure.packetThrottleInterval = ENET_HOST_TO_NET_32(interval);
	command.throttleConfigure.packetThrottleAcceleration = ENET_HOST_TO_NET_32(acceleration);
	command.throttleConfigure.packetThrottleDeceleration = ENET_HOST_TO_NET_32(deceleration);

	enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
}